

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O1

ScalarFunction * duckdb::MapContainsFun::GetFunction(void)

{
  LogicalType varargs;
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed4;
  FunctionNullHandling in_stack_fffffffffffffee0;
  allocator_type local_119;
  code *bind_lambda;
  LogicalType local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  LogicalType local_b0 [2];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  string local_68;
  LogicalType local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"map_contains","");
  LogicalType::LogicalType(&local_c8,ANY);
  LogicalType::LogicalType(&local_e0,ANY);
  LogicalType::MAP(local_b0,&local_c8,&local_e0);
  LogicalType::LogicalType(local_b0 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_b0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_119);
  LogicalType::LogicalType(&local_f8,BOOLEAN);
  bind_lambda = MapContainsFunction;
  LogicalType::LogicalType(&local_48,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_48;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffecc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffed4;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,(vector<duckdb::LogicalType,_true> *)&local_80,&local_f8,
             (scalar_function_t *)&stack0xfffffffffffffee8,MapContainsBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffee0,bind_lambda);
  LogicalType::~LogicalType(&local_48);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffee8,(_Any_data *)&stack0xfffffffffffffee8,
               __destroy_functor);
  LogicalType::~LogicalType(&local_f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_b0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_e0);
  LogicalType::~LogicalType(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

ScalarFunction MapContainsFun::GetFunction() {
	ScalarFunction fun("map_contains", {LogicalType::MAP(LogicalType::ANY, LogicalType::ANY), LogicalType::ANY},
	                   LogicalType::BOOLEAN, MapContainsFunction, MapContainsBind);
	return fun;
}